

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyCut.c
# Opt level: O1

Ivy_Store_t * Ivy_NodeFindCutsAll(Ivy_Man_t *p,Ivy_Obj_t *pObj,int nLeaves)

{
  Ivy_Cut_t *pIVar1;
  ushort uVar2;
  int IdNew0;
  int iVar3;
  void *pvVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  short sVar7;
  short sVar8;
  uint uVar9;
  Ivy_Obj_t *pIVar10;
  int iVar11;
  ulong uVar12;
  long lVar13;
  short *psVar14;
  long lVar15;
  long lVar16;
  int iVar17;
  ulong uVar18;
  Ivy_Cut_t local_54;
  
  if (6 < nLeaves) {
    __assert_fail("nLeaves <= IVY_CUT_INPUT",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/ivy/ivyCut.c"
                  ,899,"Ivy_Store_t *Ivy_NodeFindCutsAll(Ivy_Man_t *, Ivy_Obj_t *, int)");
  }
  Ivy_NodeFindCutsAll::CutStore.nCuts = 0;
  Ivy_NodeFindCutsAll::CutStore.nCutsMax = 0x100;
  local_54.nSize = 1;
  local_54.nSizeMax = (short)nLeaves;
  local_54.pArray[0] = pObj->Id;
  local_54.uHash =
       1 << ((char)(local_54.pArray[0] / 0x1f) * -0x1f + (char)local_54.pArray[0] & 0x1fU);
  Ivy_NodeCutFindOrAdd(&Ivy_NodeFindCutsAll::CutStore,&local_54);
  if (Ivy_NodeFindCutsAll::CutStore.nCuts != 1) {
    __assert_fail("pCutStore->nCuts == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/ivy/ivyCut.c"
                  ,0x390,"Ivy_Store_t *Ivy_NodeFindCutsAll(Ivy_Man_t *, Ivy_Obj_t *, int)");
  }
  lVar16 = 0xe21f28;
  lVar13 = 0;
  do {
    if (Ivy_NodeFindCutsAll::CutStore.pCuts[lVar13].nSize != 0) {
      uVar2 = Ivy_NodeFindCutsAll::CutStore.pCuts[lVar13].nSize;
      uVar18 = (ulong)uVar2;
      if (0 < (short)uVar2) {
        lVar15 = 0;
        do {
          iVar11 = *(int *)(lVar13 * 0x24 + 0xe21f28 + lVar15 * 4);
          if (((long)iVar11 < 0) || (p->vObjs->nSize <= iVar11)) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                          ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
          }
          pvVar4 = p->vObjs->pArray[iVar11];
          uVar9 = *(uint *)((long)pvVar4 + 8) & 0xf;
          if ((uVar9 != 1) && (uVar9 != 4)) {
            pIVar10 = Ivy_ObjRealFanin((Ivy_Obj_t *)
                                       (*(ulong *)((long)pvVar4 + 0x10) & 0xfffffffffffffffe));
            IdNew0 = pIVar10->Id;
            pIVar10 = Ivy_ObjRealFanin((Ivy_Obj_t *)
                                       (*(ulong *)((long)pvVar4 + 0x18) & 0xfffffffffffffffe));
            iVar3 = pIVar10->Id;
            if ((short)uVar18 < Ivy_NodeFindCutsAll::CutStore.pCuts[lVar13].nSizeMax) {
LAB_0090cb4f:
              iVar17 = iVar3;
              if (iVar3 < IdNew0) {
                iVar17 = IdNew0;
                IdNew0 = iVar3;
              }
              Ivy_NodeCutDeriveNew
                        (Ivy_NodeFindCutsAll::CutStore.pCuts + lVar13,&local_54,iVar11,IdNew0,iVar17
                        );
              Ivy_NodeCutFindOrAddFilter(&Ivy_NodeFindCutsAll::CutStore,&local_54);
              if (Ivy_NodeFindCutsAll::CutStore.nCuts == 0x100) break;
            }
            else if (0 < (short)uVar18) {
              uVar12 = 0;
              do {
                iVar17 = *(int *)(lVar16 + uVar12 * 4);
                if ((iVar17 == IdNew0) || (iVar17 == iVar3)) goto LAB_0090cb4f;
                uVar12 = uVar12 + 1;
              } while ((uVar18 & 0xffff) != uVar12);
            }
          }
          lVar15 = lVar15 + 1;
          uVar18 = (ulong)Ivy_NodeFindCutsAll::CutStore.pCuts[lVar13].nSize;
        } while (lVar15 < (long)uVar18);
      }
      if (Ivy_NodeFindCutsAll::CutStore.nCuts == 0x100) break;
    }
    lVar13 = lVar13 + 1;
    lVar16 = lVar16 + 0x24;
  } while (lVar13 < Ivy_NodeFindCutsAll::CutStore.nCuts);
  if (Ivy_NodeFindCutsAll::CutStore.nCuts < 1) {
    iVar11 = 0;
  }
  else {
    lVar13 = 0;
    psVar14 = &Ivy_NodeFindCutsAll::CutStore.pCuts[0].nSize;
    iVar11 = 0;
    do {
      if (*psVar14 != 0) {
        pIVar1 = (Ivy_Cut_t *)(psVar14 + -2);
        Ivy_NodeFindCutsAll::CutStore.pCuts[iVar11].uHash = *(uint *)(psVar14 + 0xe);
        iVar3 = pIVar1->nLatches;
        sVar7 = pIVar1->nSize;
        sVar8 = pIVar1->nSizeMax;
        uVar5 = *(undefined8 *)(psVar14 + 2);
        uVar6 = *(undefined8 *)(psVar14 + 10);
        *(undefined8 *)(Ivy_NodeFindCutsAll::CutStore.pCuts[iVar11].pArray + 2) =
             *(undefined8 *)(psVar14 + 6);
        *(undefined8 *)(Ivy_NodeFindCutsAll::CutStore.pCuts[iVar11].pArray + 4) = uVar6;
        pIVar1 = Ivy_NodeFindCutsAll::CutStore.pCuts + iVar11;
        pIVar1->nLatches = iVar3;
        pIVar1->nSize = sVar7;
        pIVar1->nSizeMax = sVar8;
        *(undefined8 *)Ivy_NodeFindCutsAll::CutStore.pCuts[iVar11].pArray = uVar5;
        iVar11 = iVar11 + 1;
      }
      lVar13 = lVar13 + 1;
      psVar14 = psVar14 + 0x12;
    } while (lVar13 < Ivy_NodeFindCutsAll::CutStore.nCuts);
  }
  Ivy_NodeFindCutsAll::CutStore.nCuts = iVar11;
  return &Ivy_NodeFindCutsAll::CutStore;
}

Assistant:

Ivy_Store_t * Ivy_NodeFindCutsAll( Ivy_Man_t * p, Ivy_Obj_t * pObj, int nLeaves )
{
    static Ivy_Store_t CutStore, * pCutStore = &CutStore;
    Ivy_Cut_t CutNew, * pCutNew = &CutNew, * pCut;
    Ivy_Obj_t * pLeaf;
    int i, k, iLeaf0, iLeaf1;

    assert( nLeaves <= IVY_CUT_INPUT );

    // start the structure
    pCutStore->nCuts = 0;
    pCutStore->nCutsMax = IVY_CUT_LIMIT;
    // start the trivial cut
    pCutNew->uHash = 0;
    pCutNew->nSize = 1;
    pCutNew->nSizeMax = nLeaves;
    pCutNew->pArray[0] = pObj->Id;
    Ivy_NodeCutHash( pCutNew );
    // add the trivial cut
    Ivy_NodeCutFindOrAdd( pCutStore, pCutNew );
    assert( pCutStore->nCuts == 1 );

    // explore the cuts
    for ( i = 0; i < pCutStore->nCuts; i++ )
    {
        // expand this cut
        pCut = pCutStore->pCuts + i;
        if ( pCut->nSize == 0 )
            continue;
        for ( k = 0; k < pCut->nSize; k++ )
        {
            pLeaf = Ivy_ManObj( p, pCut->pArray[k] );
            if ( Ivy_ObjIsCi(pLeaf) )
                continue;
/*
            *pCutNew = *pCut;
            Ivy_NodeCutShrink( pCutNew, pLeaf->Id );
            if ( !Ivy_NodeCutExtend( pCutNew, Ivy_ObjFaninId0(pLeaf) ) )
                continue;
            if ( Ivy_ObjIsNode(pLeaf) && !Ivy_NodeCutExtend( pCutNew, Ivy_ObjFaninId1(pLeaf) ) )
                continue;
            Ivy_NodeCutHash( pCutNew );
*/
            iLeaf0 = Ivy_ObjId( Ivy_ObjRealFanin(Ivy_ObjFanin0(pLeaf)) );
            iLeaf1 = Ivy_ObjId( Ivy_ObjRealFanin(Ivy_ObjFanin1(pLeaf)) );
//            if ( iLeaf0 == iLeaf1 ) // strange situation observed on Jan 18, 2007
//                continue;
            if ( !Ivy_NodeCutPrescreen( pCut, iLeaf0, iLeaf1 ) )
                continue;
            if ( iLeaf0 > iLeaf1 )
                Ivy_NodeCutDeriveNew( pCut, pCutNew, pCut->pArray[k], iLeaf1, iLeaf0 );
            else
                Ivy_NodeCutDeriveNew( pCut, pCutNew, pCut->pArray[k], iLeaf0, iLeaf1 );
            Ivy_NodeCutFindOrAddFilter( pCutStore, pCutNew );
            if ( pCutStore->nCuts == IVY_CUT_LIMIT )
                break;
        }
        if ( pCutStore->nCuts == IVY_CUT_LIMIT )
            break;
    }
    Ivy_NodeCompactCuts( pCutStore );
//    Ivy_NodePrintCuts( pCutStore );
    return pCutStore;
}